

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_ex(CPUS390XState_conflict *env,uint32_t ilen,uint64_t r1,uint64_t addr)

{
  uint64_t *puVar1;
  uint uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t uVar10;
  
  uVar4 = cpu_lduw_code_s390x(env,addr);
  uVar9 = (ulong)((uint)r1 & 0xff | uVar4) << 0x30;
  if (*(int *)(&DAT_00dc882c + (uVar4 >> 0xc & 0xc)) != 2) {
    if (*(int *)(&DAT_00dc882c + (uVar4 >> 0xc & 0xc)) == 6) {
      uVar5 = cpu_ldl_code_s390x(env,addr + 2);
      uVar6 = (ulong)uVar5 << 0x10;
    }
    else {
      uVar5 = cpu_lduw_code_s390x(env,addr + 2);
      uVar6 = (ulong)uVar5 << 0x20;
    }
    uVar9 = uVar9 | uVar6;
  }
  uVar3 = (ushort)(uVar9 >> 0x30);
  if ((uVar4 >> 8 & 0xf0) == 0xd0) {
    uVar8 = uVar4 >> 8 & 0xf;
    if ((0xcf0aU >> uVar8 & 1) == 0) {
      uVar2 = (uint)(uVar9 >> 0x20);
      uVar6 = (env->psw).mask;
      uVar7 = (ulong)(uVar2 & 0xfff) + env->regs[uVar2 >> 0xc & 0xf];
      if ((uVar6 >> 0x20 & 1) == 0) {
        if ((int)uVar6 < 0) {
          uVar7 = (uint64_t)((uint)uVar7 & 0x7fffffff);
        }
        else {
          uVar7 = (uint64_t)((uint)uVar7 & 0xffffff);
        }
      }
      uVar10 = (ulong)((uint)uVar9 >> 0x10 & 0xfff) + env->regs[uVar9 >> 0x1c & 0xf];
      if ((uVar6 >> 0x20 & 1) == 0) {
        if ((int)uVar6 < 0) {
          uVar10 = (uint64_t)((uint)uVar10 & 0x7fffffff);
        }
        else {
          uVar10 = (uint64_t)((uint)uVar10 & 0xffffff);
        }
      }
      uVar4 = (*helper_ex::dx[uVar8])(env,uVar3 & 0xff,uVar7,uVar10,0);
      env->cc_op = uVar4;
      puVar1 = &(env->psw).addr;
      *puVar1 = *puVar1 + (ulong)ilen;
      return;
    }
  }
  else if ((char)(uVar4 >> 8) == '\n') {
    env->int_svc_code = uVar3 & 0xff;
    env->int_svc_ilen = ilen;
    helper_exception(env,2);
  }
  env->ex_value = uVar9 | ilen;
  return;
}

Assistant:

void HELPER(ex)(CPUS390XState *env, uint32_t ilen, uint64_t r1, uint64_t addr)
{
    uint64_t insn = cpu_lduw_code(env, addr);
    uint8_t opc = insn >> 8;

    /* Or in the contents of R1[56:63].  */
    insn |= r1 & 0xff;

    /* Load the rest of the instruction.  */
    insn <<= 48;
    switch (get_ilen(opc)) {
    case 2:
        break;
    case 4:
        insn |= (uint64_t)cpu_lduw_code(env, addr + 2) << 32;
        break;
    case 6:
        insn |= (uint64_t)(uint32_t)cpu_ldl_code(env, addr + 2) << 16;
        break;
    default:
        g_assert_not_reached();
    }

    /* The very most common cases can be sped up by avoiding a new TB.  */
    if ((opc & 0xf0) == 0xd0) {
        typedef uint32_t (*dx_helper)(CPUS390XState *, uint32_t, uint64_t,
                                      uint64_t, uintptr_t);
        static const dx_helper dx[16] = {
            [0x0] = do_helper_trt_bkwd,
            [0x2] = do_helper_mvc,
            [0x4] = do_helper_nc,
            [0x5] = do_helper_clc,
            [0x6] = do_helper_oc,
            [0x7] = do_helper_xc,
            [0xc] = do_helper_tr,
            [0xd] = do_helper_trt_fwd,
        };
        dx_helper helper = dx[opc & 0xf];

        if (helper) {
            uint32_t l = extract64(insn, 48, 8);
            uint32_t b1 = extract64(insn, 44, 4);
            uint32_t d1 = extract64(insn, 32, 12);
            uint32_t b2 = extract64(insn, 28, 4);
            uint32_t d2 = extract64(insn, 16, 12);
            uint64_t a1 = wrap_address(env, env->regs[b1] + d1);
            uint64_t a2 = wrap_address(env, env->regs[b2] + d2);

            env->cc_op = helper(env, l, a1, a2, 0);
            env->psw.addr += ilen;
            return;
        }
    } else if (opc == 0x0a) {
        env->int_svc_code = extract64(insn, 48, 8);
        env->int_svc_ilen = ilen;
        helper_exception(env, EXCP_SVC);
        g_assert_not_reached();
    }

    /* Record the insn we want to execute as well as the ilen to use
       during the execution of the target insn.  This will also ensure
       that ex_value is non-zero, which flags that we are in a state
       that requires such execution.  */
    env->ex_value = insn | ilen;
}